

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O3

void __thiscall
OpenMesh::
AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
::AttribKernelT(AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  ArrayKernel::ArrayKernel((ArrayKernel *)this);
  (this->super_PolyConnectivity).next_cache_.
  super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PolyConnectivity).next_cache_.
  super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PolyConnectivity).edgeData_.
  super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PolyConnectivity).next_cache_.
  super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PolyConnectivity).edgeData_.
  super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PolyConnectivity).edgeData_.
  super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined ***)&this->super_PolyConnectivity = &PTR__PolyConnectivity_001b12c0;
  (this->points_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle.idx_ = -1;
  (this->vertex_normals_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle.idx_
       = -1;
  (this->vertex_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
  super_BaseHandle.idx_ = -1;
  (this->vertex_texcoords1D_).super_BasePropHandleT<float>.super_BaseHandle.idx_ = -1;
  (this->vertex_texcoords2D_).super_BasePropHandleT<OpenMesh::VectorT<float,_2>_>.super_BaseHandle.
  idx_ = -1;
  (this->vertex_texcoords3D_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->halfedge_texcoords1D_).super_BasePropHandleT<float>.super_BaseHandle.idx_ = -1;
  (this->halfedge_texcoords2D_).super_BasePropHandleT<OpenMesh::VectorT<float,_2>_>.super_BaseHandle
  .idx_ = -1;
  (this->halfedge_texcoords3D_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle
  .idx_ = -1;
  (this->halfedge_normals_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->halfedge_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
  super_BaseHandle.idx_ = -1;
  (this->edge_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->face_normals_).super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.super_BaseHandle.idx_ =
       -1;
  (this->face_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->face_texture_index_).super_BasePropHandleT<int>.super_BaseHandle.idx_ = -1;
  (this->data_vpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_vpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_hpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_epph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_fpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  this->refcount_vnormals_ = 0;
  this->refcount_vcolors_ = 0;
  this->refcount_vtexcoords1D_ = 0;
  this->refcount_vtexcoords2D_ = 0;
  this->refcount_vtexcoords3D_ = 0;
  this->refcount_htexcoords1D_ = 0;
  this->refcount_htexcoords2D_ = 0;
  this->refcount_htexcoords3D_ = 0;
  this->refcount_henormals_ = 0;
  this->refcount_hecolors_ = 0;
  this->refcount_ecolors_ = 0;
  this->refcount_fnormals_ = 0;
  this->refcount_fcolors_ = 0;
  this->refcount_ftextureIndex_ = 0;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"v:points","");
  BaseKernel::add_property<OpenMesh::VectorT<float,3>>((BaseKernel *)this,&this->points_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<vprop>","");
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this,&this->data_vpph_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<fprop>","");
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this,&this->data_fpph_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<hprop>","");
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this,&this->data_hpph_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<eprop>","");
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
            ((BaseKernel *)this,&this->data_epph_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AttribKernelT()
  : refcount_vnormals_(0),
    refcount_vcolors_(0),
    refcount_vtexcoords1D_(0),
    refcount_vtexcoords2D_(0),
    refcount_vtexcoords3D_(0),
    refcount_htexcoords1D_(0),
    refcount_htexcoords2D_(0),
    refcount_htexcoords3D_(0),
    refcount_henormals_(0),
    refcount_hecolors_(0),
    refcount_ecolors_(0),
    refcount_fnormals_(0),
    refcount_fcolors_(0),
    refcount_ftextureIndex_(0)
  {
    this->add_property( points_, "v:points" );

    if (VAttribs & Attributes::Normal)
      request_vertex_normals();

    if (VAttribs & Attributes::Color)
      request_vertex_colors();

    if (VAttribs & Attributes::TexCoord1D)
      request_vertex_texcoords1D();

    if (VAttribs & Attributes::TexCoord2D)
      request_vertex_texcoords2D();

    if (VAttribs & Attributes::TexCoord3D)
      request_vertex_texcoords3D();

    if (HAttribs & Attributes::TexCoord1D)
      request_halfedge_texcoords1D();

    if (HAttribs & Attributes::TexCoord2D)
      request_halfedge_texcoords2D();

    if (HAttribs & Attributes::TexCoord3D)
      request_halfedge_texcoords3D();

    if (HAttribs & Attributes::Color)
      request_halfedge_colors();

    if (VAttribs & Attributes::Status)
      Connectivity::request_vertex_status();

    if (HAttribs & Attributes::Status)
      Connectivity::request_halfedge_status();

    if (HAttribs & Attributes::Normal)
      request_halfedge_normals();

    if (EAttribs & Attributes::Status)
      Connectivity::request_edge_status();
    
    if (EAttribs & Attributes::Color)
      request_edge_colors();

    if (FAttribs & Attributes::Normal)
      request_face_normals();

    if (FAttribs & Attributes::Color)
      request_face_colors();

    if (FAttribs & Attributes::Status)
      Connectivity::request_face_status();

    if (FAttribs & Attributes::TextureIndex)
      request_face_texture_index();

    //FIXME: data properties might actually cost storage even
    //if there are no data traits??
    this->add_property(data_vpph_);
    this->add_property(data_fpph_);
    this->add_property(data_hpph_);
    this->add_property(data_epph_);
  }